

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O3

prf_model_t * prf_model_create(void)

{
  prf_model_t *ppVar1;
  
  ppVar1 = (prf_model_t *)malloc(0x28);
  if (ppVar1 == (prf_model_t *)0x0) {
    prf_error(9,"memory allocation error (returned NULL)");
  }
  else {
    ppVar1->header = (prf_node_t *)0x0;
    ppVar1->mempool_id = 0;
    ppVar1->vertex_palette = (prf_node_t *)0x0;
    ppVar1->vertextras = (prf_vertex_pool_s **)0x0;
    ppVar1->ofversion = 0;
  }
  return ppVar1;
}

Assistant:

prf_model_t *
prf_model_create(
    void )
{
    prf_model_t * model;
    model = (prf_model_t *)malloc( sizeof( prf_model_t ) );
    if ( model == NULL )
        prf_error( 9, "memory allocation error (returned NULL)" );
    prf_model_clear( model );
    return model;
}